

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_filter.cc
# Opt level: O2

void __thiscall sptk::reaper::FdFilter::FilterBuffer(FdFilter *this,int n_input,int *n_output)

{
  short *psVar1;
  int16_t iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  short *psVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  int16_t *piVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  float *pfVar16;
  FdFilter *pFVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  int iVar21;
  float *pfVar22;
  int *piVar23;
  int iVar24;
  int16_t *piVar25;
  bool bVar26;
  float fVar27;
  float fVar28;
  
  uVar8 = this->filter_state_;
  if ((uVar8 & 1) == 0) {
    iVar24 = this->left_over_;
  }
  else {
    this->to_skip_ = 0;
    this->left_over_ = 0;
    this->first_out_ = 0;
    iVar11 = this->n_filter_coeffs_;
    iVar4 = this->max_input_;
    pfVar22 = this->output_delayed_;
    iVar24 = 0;
    for (lVar9 = 0; (int)lVar9 != iVar11 + iVar4; lVar9 = lVar9 + 1) {
      pfVar22[lVar9] = 0.0;
    }
  }
  iVar7 = iVar24 + n_input;
  iVar11 = this->fft_size_;
  iVar4 = iVar7 / iVar11;
  piVar25 = this->leftovers_ + iVar24;
  piVar12 = this->input_buffer_;
  if (((uVar8 & 2) == 0) || (iVar21 = n_input, iVar4 != 0)) {
    for (lVar9 = 0; iVar11 - iVar24 != (int)lVar9; lVar9 = lVar9 + 1) {
      iVar2 = *piVar12;
      piVar12 = piVar12 + 1;
      piVar25[lVar9] = iVar2;
    }
    if (iVar4 == 0 && (uVar8 & 2) == 0) {
      this->left_over_ = iVar7;
      *n_output = 0;
      this->first_out_ = this->first_out_ | this->filter_state_ & 1U;
      return;
    }
  }
  else {
    while (iVar21 != 0) {
      iVar2 = *piVar12;
      piVar12 = piVar12 + 1;
      *piVar25 = iVar2;
      piVar25 = piVar25 + 1;
      iVar21 = iVar21 + -1;
    }
    lVar9 = 0;
    iVar24 = iVar11 - iVar7;
    if (iVar11 - iVar7 < 1) {
      iVar24 = 0;
    }
    iVar4 = 1;
    for (; iVar24 != (int)lVar9; lVar9 = lVar9 + 1) {
      piVar25[lVar9] = 0;
    }
  }
  this->filter_state_ = uVar8 | this->first_out_;
  this->first_out_ = 0;
  pfVar22 = this->output_delayed_;
  iVar24 = 0;
  iVar7 = 0;
  if (0 < iVar4) {
    iVar24 = 0;
    iVar7 = iVar4;
  }
  for (; iVar24 != iVar7; iVar24 = iVar24 + 1) {
    if (iVar24 == 0) {
      piVar25 = this->leftovers_;
      pfVar19 = this->x_;
      iVar11 = this->fft_size_by2_;
      pfVar18 = this->y_;
      lVar9 = 0;
      for (lVar5 = 0; iVar11 != (int)lVar5; lVar5 = lVar5 + 1) {
        pfVar19[lVar5] = (float)(int)piVar25[lVar5];
        pfVar18[lVar5] = (float)(int)piVar25[iVar11 + lVar5];
        lVar9 = lVar9 + -4;
      }
      lVar5 = (long)pfVar19 - lVar9;
      lVar9 = (long)pfVar18 - lVar9;
    }
    else {
      iVar11 = this->fft_size_by2_;
      pfVar19 = this->x_;
      pfVar18 = this->y_;
      lVar14 = 0;
      lVar9 = 0;
      iVar21 = iVar11;
      while (bVar26 = iVar21 != 0, iVar21 = iVar21 + -1, bVar26) {
        *(float *)((long)pfVar19 + lVar14 * 2) = (float)(int)*(short *)((long)piVar12 + lVar14);
        *(float *)((long)pfVar18 + lVar14 * 2) =
             (float)(int)*(short *)((long)piVar12 + lVar14 + (long)iVar11 * 2);
        lVar9 = lVar9 + -4;
        lVar14 = lVar14 + 2;
      }
      lVar5 = (long)pfVar19 - lVar9;
      lVar9 = (long)pfVar18 - lVar9;
      piVar12 = (int16_t *)((long)piVar12 + lVar14 + (long)iVar11 * 2);
    }
    for (lVar14 = 0; iVar11 != (int)lVar14; lVar14 = lVar14 + 1) {
      *(undefined4 *)(lVar9 + lVar14 * 4) = 0;
      *(undefined4 *)(lVar5 + lVar14 * 4) = 0;
    }
    pFVar17 = (FdFilter *)this->fft_;
    FFT::fft((FFT *)pFVar17,this->x_,this->y_);
    ComplexDotProduct(pFVar17,this->fft_size_,this->x_,this->y_,this->xf_,(float *)0x0,this->x_,
                      this->y_);
    FFT::ifft(this->fft_,this->x_,this->y_);
    iVar11 = this->fft_size_;
    uVar8 = this->n_filter_coeffs_by2_;
    lVar5 = (long)(int)uVar8;
    pfVar19 = this->x_;
    lVar14 = (long)iVar11;
    lVar10 = (long)(int)(iVar11 - uVar8);
    pfVar18 = pfVar22;
    for (lVar9 = lVar10; lVar9 < lVar14; lVar9 = lVar9 + 1) {
      *pfVar18 = pfVar19[lVar9] + *pfVar18;
      pfVar18 = pfVar18 + 1;
    }
    pfVar19 = this->x_;
    uVar15 = 0;
    if (0 < (int)uVar8) {
      uVar15 = (ulong)uVar8;
    }
    for (lVar9 = 0; uVar15 * 4 != lVar9; lVar9 = lVar9 + 4) {
      *(float *)((long)pfVar18 + lVar9) =
           *(float *)((long)pfVar19 + lVar9) + *(float *)((long)pfVar18 + lVar9);
    }
    pfVar19 = this->x_;
    pfVar18 = (float *)((long)pfVar18 + lVar9);
    for (lVar9 = lVar5; lVar9 < lVar10; lVar9 = lVar9 + 1) {
      *pfVar18 = pfVar19[lVar9];
      pfVar18 = pfVar18 + 1;
    }
    pfVar19 = pfVar22 + this->fft_size_by2_;
    pfVar18 = this->y_;
    for (lVar9 = lVar10; lVar9 < lVar14; lVar9 = lVar9 + 1) {
      *pfVar19 = pfVar18[lVar9] + *pfVar19;
      pfVar19 = pfVar19 + 1;
    }
    pfVar18 = this->y_;
    for (lVar9 = 0; uVar15 * 4 != lVar9; lVar9 = lVar9 + 4) {
      *(float *)((long)pfVar19 + lVar9) =
           *(float *)((long)pfVar18 + lVar9) + *(float *)((long)pfVar19 + lVar9);
    }
    pfVar18 = this->y_;
    pfVar19 = (float *)((long)pfVar19 + lVar9);
    for (; lVar5 < lVar10; lVar5 = lVar5 + 1) {
      *pfVar19 = pfVar18[lVar5];
      pfVar19 = pfVar19 + 1;
    }
    pfVar22 = pfVar22 + lVar14;
  }
  iVar24 = n_input - (int)((ulong)((long)piVar12 - (long)this->input_buffer_) >> 1);
  this->left_over_ = iVar24;
  psVar6 = this->leftovers_;
  for (lVar9 = 0; iVar24 != (int)lVar9; lVar9 = lVar9 + 1) {
    psVar6[lVar9] = piVar12[lVar9];
  }
  uVar8 = this->filter_state_;
  if ((uVar8 & 2) != 0 && iVar24 != 0) {
    for (lVar9 = 0; iVar11 - iVar24 != (int)lVar9; lVar9 = lVar9 + 1) {
      psVar6[iVar24 + lVar9] = 0;
    }
    iVar24 = this->fft_size_by2_;
    pfVar19 = this->x_;
    pfVar18 = this->y_;
    pfVar16 = pfVar19;
    pfVar20 = pfVar18;
    iVar11 = iVar24;
    while (bVar26 = iVar11 != 0, iVar11 = iVar11 + -1, bVar26) {
      *pfVar16 = (float)(int)*psVar6;
      psVar1 = psVar6 + iVar24;
      psVar6 = psVar6 + 1;
      pfVar16 = pfVar16 + 1;
      *pfVar20 = (float)(int)*psVar1;
      pfVar20 = pfVar20 + 1;
    }
    for (lVar9 = 0; iVar24 != (int)lVar9; lVar9 = lVar9 + 1) {
      pfVar20[lVar9] = 0.0;
      pfVar16[lVar9] = 0.0;
    }
    pFVar17 = (FdFilter *)this->fft_;
    FFT::fft((FFT *)pFVar17,pfVar19,pfVar18);
    ComplexDotProduct(pFVar17,this->fft_size_,this->x_,this->y_,this->xf_,(float *)0x0,this->x_,
                      this->y_);
    FFT::ifft(this->fft_,this->x_,this->y_);
    iVar11 = this->fft_size_;
    uVar8 = this->n_filter_coeffs_by2_;
    lVar5 = (long)(int)uVar8;
    pfVar19 = this->x_;
    lVar14 = (long)(int)(iVar11 - uVar8);
    pfVar18 = pfVar22;
    for (lVar9 = lVar14; lVar9 < iVar11; lVar9 = lVar9 + 1) {
      *pfVar18 = pfVar19[lVar9] + *pfVar18;
      pfVar18 = pfVar18 + 1;
    }
    pfVar19 = this->x_;
    lVar9 = 0;
    uVar15 = 0;
    if (0 < (int)uVar8) {
      uVar15 = (ulong)uVar8;
    }
    for (; uVar15 * 4 != lVar9; lVar9 = lVar9 + 4) {
      *(float *)((long)pfVar18 + lVar9) =
           *(float *)((long)pfVar19 + lVar9) + *(float *)((long)pfVar18 + lVar9);
    }
    pfVar19 = this->x_;
    for (lVar10 = 0; lVar5 + lVar10 < lVar14; lVar10 = lVar10 + 1) {
      *(float *)((long)pfVar18 + lVar10 * 4 + lVar9) = pfVar19[lVar5 + lVar10];
    }
    pfVar22 = pfVar22 + this->fft_size_by2_;
    pfVar19 = this->y_;
    for (lVar9 = lVar14; lVar9 < iVar11; lVar9 = lVar9 + 1) {
      *pfVar22 = pfVar19[lVar9] + *pfVar22;
      pfVar22 = pfVar22 + 1;
    }
    pfVar19 = this->y_;
    for (lVar9 = 0; uVar15 * 4 != lVar9; lVar9 = lVar9 + 4) {
      *(float *)((long)pfVar22 + lVar9) =
           *(float *)((long)pfVar19 + lVar9) + *(float *)((long)pfVar22 + lVar9);
    }
    pfVar19 = this->y_;
    for (lVar10 = 0; lVar5 + lVar10 < lVar14; lVar10 = lVar10 + 1) {
      *(float *)((long)pfVar22 + lVar10 * 4 + lVar9) = pfVar19[lVar5 + lVar10];
    }
    uVar8 = this->filter_state_;
  }
  uVar13 = this->n_filter_coeffs_by2_ + this->left_over_ & (int)(uVar8 << 0x1e) >> 0x1f;
  iVar11 = iVar11 * iVar4 - ((-(uVar8 & 1) & this->n_filter_coeffs_by2_) + this->to_skip_);
  iVar24 = (int)(iVar11 + uVar13 + -1) / this->decimate_ + 1;
  *n_output = iVar24;
  piVar12 = this->output_buffer_;
  pfVar22 = this->output_delayed_;
  piVar23 = &this->n_filter_coeffs_by2_;
  if ((this->filter_state_ & 1) == 0) {
    piVar23 = &this->to_skip_;
  }
  pfVar19 = pfVar22 + *piVar23;
  iVar7 = this->decimate_;
  for (lVar9 = 0; iVar24 != (int)lVar9; lVar9 = lVar9 + 1) {
    fVar27 = 32767.0;
    if (*pfVar19 <= 32767.0) {
      fVar27 = *pfVar19;
    }
    fVar28 = -32768.0;
    if (-32768.0 <= fVar27) {
      fVar28 = fVar27;
    }
    piVar12[lVar9] = (int16_t)(int)(fVar28 + *(float *)(&DAT_00125f88 + (ulong)(0.0 < fVar28) * 4));
    pfVar19 = pfVar19 + iVar7;
  }
  iVar21 = this->fft_size_;
  iVar3 = this->n_filter_coeffs_;
  for (lVar9 = 0; iVar3 != (int)lVar9; lVar9 = lVar9 + 1) {
    pfVar22[lVar9] = pfVar22[iVar4 * iVar21 + lVar9];
  }
  this->to_skip_ = iVar24 * iVar7 - (iVar11 + uVar13);
  return;
}

Assistant:

void FdFilter::FilterBuffer(int n_input, int *n_output) {
  int16_t *p, *r, *p2;
  float *dp1, *dp2, *q, half = 0.5;
  int  i, j, k, npass;
  int totaln;

  if (filter_state_ & 1) {  /* first call with this signal and filter? */
    first_out_ = 0;
    to_skip_ = 0;
    left_over_ = 0;
    for (i = max_input_+n_filter_coeffs_, q = output_delayed_; i--;)
      *q++ = 0.0;
  }    /* end of once-per-filter-invocation initialization */

  npass = (n_input + left_over_) / fft_size_;
  if (!npass && (filter_state_ & 2)) {  // if it's the end...
    // Append the input to the leftovers, then pad with zeros.
    p = input_buffer_;
    for (p = input_buffer_, r = leftovers_ + left_over_, i = n_input; i--;) {
      *r++ = *p++; /* append to leftovers_ from prev. call */
    }
    int to_pad = fft_size_ - (left_over_ + n_input);
    for (int i = 0; i < to_pad; ++i) {
      *r++ = 0;
    }
    npass = 1;
  } else {
    /* This is the normal non-boundary course of action. */
    for (p = input_buffer_, r = leftovers_ + left_over_,
           i = fft_size_ - left_over_; i--;)
      *r++ = *p++; /* append to leftovers_ from prev. call */
  }
  if (!npass && !(filter_state_ & 2)) {  // it's not the end, but don't
                                       // have enough data for a loop.
    left_over_ += n_input;
    *n_output = 0;
    first_out_ |= filter_state_ & 1;  // flag that start of sig is still here.
    return;
  }
  filter_state_ |= first_out_;
  first_out_ = 0;

  /* >>>>>>>>>>>>>> Here's the main processing loop. <<<<<<<<<<<<< */
  for (/* p set up above */ q = output_delayed_, i = 0; i < npass;
                            i++, q += fft_size_) {
    if (i) {
      for (r = p + fft_size_by2_, j = fft_size_by2_, dp1 = x_, dp2 = y_; j--;) {
        *dp1++ = *p++;
        *dp2++ = *r++;
      }
      p += fft_size_by2_;
    } else {
      for (p2 = leftovers_, r = p2 + fft_size_by2_, j = fft_size_by2_,
             dp1 = x_, dp2 = y_; j--;) {
        *dp1++ = *p2++;
        *dp2++ = *r++;
      }
    }
    for (j = fft_size_by2_; j--;)
      *dp1++ = *dp2++ = 0.0;

    /* Filtering is done in the frequency domain; transform two real arrays. */
    fft_->fft(x_, y_);
    ComplexDotProduct(fft_size_, x_, y_, xf_, NULL, x_, y_);
    fft_->ifft(x_, y_);

    /* Overlap and add. */
    for (dp2 = q, j = fft_size_ - n_filter_coeffs_by2_; j < fft_size_; j++)
      *dp2++ += x_[j];
    for (j = 0, k = n_filter_coeffs_by2_; j < k; j++)
      *dp2++ += x_[j];
    for (j = n_filter_coeffs_by2_, k = fft_size_ - n_filter_coeffs_by2_;
         j < k; j++)
      *dp2++ = x_[j];

    for (dp2 = q+fft_size_by2_, j = fft_size_ - n_filter_coeffs_by2_;
         j < fft_size_; j++)
      *dp2++ += y_[j];
    for (j = 0, k = n_filter_coeffs_by2_; j < k; j++)
      *dp2++ += y_[j];
    for (j = n_filter_coeffs_by2_, k = fft_size_ - n_filter_coeffs_by2_;
         j < k; j++)
      *dp2++ = y_[j];
  }    /* end of main processing loop */

  left_over_ = n_input - (p-input_buffer_);
  for (i = left_over_, r = leftovers_; i--;)  // Save unused input
                                              // samples for next call.
    *r++ = *p++;
  /* If signal end is here, must process any unused input. */
  if (left_over_ && (filter_state_ & 2)) {  // Must do one more zero-pad pass.
    for (p2 = leftovers_ + left_over_, i = fft_size_ - left_over_; i--;)
      *p2++ = 0;
    for (p2 = leftovers_, r = p2 + fft_size_by2_, j = fft_size_by2_,
           dp1 = x_, dp2 = y_; j--;) {
      *dp1++ = *p2++;
      *dp2++ = *r++;
    }
    for (j = fft_size_by2_; j--;)
      *dp1++ = *dp2++ = 0.0;
    /* Filtering is done in the frequency domain; transform two real arrays. */
    fft_->fft(x_, y_);
    ComplexDotProduct(fft_size_, x_, y_, xf_, NULL, x_, y_);
    fft_->ifft(x_, y_);

    /* Overlap and add. */
    for (dp2 = q, j = fft_size_ - n_filter_coeffs_by2_; j < fft_size_; j++)
      *dp2++ += x_[j];
    for (j = 0, k = n_filter_coeffs_by2_; j < k; j++)
      *dp2++ += x_[j];
    for (j = n_filter_coeffs_by2_, k = fft_size_ - n_filter_coeffs_by2_;
         j < k; j++)
      *dp2++ = x_[j];

    for (dp2 = q+fft_size_by2_, j = fft_size_ - n_filter_coeffs_by2_;
         j < fft_size_; j++)
      *dp2++ += y_[j];
    for (j = 0, k = n_filter_coeffs_by2_; j < k; j++)
      *dp2++ += y_[j];
    for (j = n_filter_coeffs_by2_, k = fft_size_ - n_filter_coeffs_by2_;
         j < k; j++)
      *dp2++ = y_[j];
  }
  /* total good output samples in ob: */
  totaln = (((npass * fft_size_) - to_skip_ -
             ((1 & filter_state_)? n_filter_coeffs_by2_ : 0)) +
            ((filter_state_ & 2)? left_over_ + n_filter_coeffs_by2_ : 0));
  /* number returned to caller: */
  *n_output = 1 + (totaln - 1) / decimate_;  // possible decimation for
                                           // downsampling
  /* Round, decimate and output the samples. */
  float f_temp;
  q = (filter_state_ & 1)? output_delayed_ + (n_filter_coeffs_by2_) :
                                output_delayed_ + to_skip_;
  for (j = decimate_, i =  *n_output, p = output_buffer_; i-- ; q += j) {
    if ((f_temp = *q) > 32767.0)
      f_temp = 32767.0;
    if (f_temp < -32768.0)
      f_temp = -32768.0;
    *p++ = static_cast<int16_t>((f_temp > 0.0) ? half + f_temp : f_temp - half);
  }

  for (dp1 = output_delayed_ + npass*fft_size_, j = n_filter_coeffs_,
         dp2 = output_delayed_; j--;) /*save mem for next call */
    *dp2++ = *dp1++;
  /* If decimating, number to skip on next call. */
  to_skip_ = (*n_output * decimate_) - totaln;
}